

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_h_predictor_8x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint uVar21;
  short sVar22;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 auVar23 [16];
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar35 [16];
  ushort uVar48;
  ushort uVar49;
  
  auVar23 = pshuflw(ZEXT116(top_row[7]),ZEXT116(top_row[7]),0);
  sVar22 = auVar23._0_2_;
  sVar30 = auVar23._2_2_;
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = (char)(uVar1 >> 0x28);
  auVar7._11_4_ = auVar5._11_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = (char)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._9_6_ = auVar9._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar11._8_7_;
  auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
  auVar17[0] = (char)(uVar1 >> 0x18);
  auVar17._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar18._11_4_ = 0;
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14._0_2_ = (ushort)uVar1;
  auVar14._3_12_ = SUB1512(auVar18 << 0x20,3);
  auVar23._0_2_ = (ushort)uVar1 & 0xff;
  auVar23._2_13_ = auVar14._2_13_;
  auVar23[0xf] = 0;
  sVar24 = sVar30 * 0x3b + 0x80;
  sVar25 = sVar22 * 0x6e + 0x80;
  sVar26 = sVar30 * 0x97 + 0x80;
  sVar27 = sVar22 * 0xb7 + 0x80;
  sVar28 = sVar30 * 0xce + 0x80;
  sVar29 = sVar22 * 0xdb + 0x80;
  sVar30 = sVar30 * 0xe0 + 0x80;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar35._4_4_ = uVar21;
    auVar35._0_4_ = uVar21;
    auVar35._8_4_ = uVar21;
    auVar35._12_4_ = uVar21;
    auVar35 = pshufb(auVar23,auVar35);
    uVar33 = auVar35._0_2_ * 0xff + sVar22 + 0x80;
    uVar36 = auVar35._2_2_ * 0xc5 + sVar24;
    uVar38 = auVar35._4_2_ * 0x92 + sVar25;
    uVar40 = auVar35._6_2_ * 0x69 + sVar26;
    uVar42 = auVar35._8_2_ * 0x49 + sVar27;
    uVar44 = auVar35._10_2_ * 0x32 + sVar28;
    uVar46 = auVar35._12_2_ * 0x25 + sVar29;
    uVar48 = auVar35._14_2_ * 0x20 + sVar30;
    uVar34 = uVar33 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49),
                  CONCAT16((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                           CONCAT15((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) -
                                    (0xff < uVar45),
                                    CONCAT14((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8)
                                             - (0xff < uVar43),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar39 != 0) * (uVar39 < 0x100) *
                                                               (char)(uVar38 >> 8) - (0xff < uVar39)
                                                               ,CONCAT11((uVar37 != 0) *
                                                                         (uVar37 < 0x100) *
                                                                         (char)(uVar36 >> 8) -
                                                                         (0xff < uVar37),
                                                                         (uVar34 != 0) *
                                                                         (uVar34 < 0x100) *
                                                                         (char)(uVar33 >> 8) -
                                                                         (0xff < uVar34))))))));
    dst = dst + stride;
  } while (uVar21 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xc] = (char)(uVar1 >> 0x30);
  auVar6._13_2_ = auVar4._13_2_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[10] = (char)(uVar1 >> 0x28);
  auVar10._11_4_ = auVar8._11_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._10_5_ = auVar10._10_5_;
  auVar13[8] = (char)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar13._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = (char)(uVar1 >> 0x18);
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = (char)(uVar1 >> 0x10);
  auVar20._11_4_ = 0;
  auVar31._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar31[2] = (char)(uVar1 >> 8);
  auVar31[0] = (byte)uVar1;
  auVar31[1] = 0;
  auVar31[0xf] = 0;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar32._4_4_ = uVar21;
    auVar32._0_4_ = uVar21;
    auVar32._8_4_ = uVar21;
    auVar32._12_4_ = uVar21;
    auVar23 = pshufb(auVar31,auVar32);
    uVar33 = auVar23._0_2_ * 0xff + sVar22 + 0x80;
    uVar36 = auVar23._2_2_ * 0xc5 + sVar24;
    uVar38 = auVar23._4_2_ * 0x92 + sVar25;
    uVar40 = auVar23._6_2_ * 0x69 + sVar26;
    uVar42 = auVar23._8_2_ * 0x49 + sVar27;
    uVar44 = auVar23._10_2_ * 0x32 + sVar28;
    uVar46 = auVar23._12_2_ * 0x25 + sVar29;
    uVar48 = auVar23._14_2_ * 0x20 + sVar30;
    uVar34 = uVar33 >> 8;
    uVar37 = uVar36 >> 8;
    uVar39 = uVar38 >> 8;
    uVar41 = uVar40 >> 8;
    uVar43 = uVar42 >> 8;
    uVar45 = uVar44 >> 8;
    uVar47 = uVar46 >> 8;
    uVar49 = uVar48 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar48 >> 8) - (0xff < uVar49),
                  CONCAT16((uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47),
                           CONCAT15((uVar45 != 0) * (uVar45 < 0x100) * (char)(uVar44 >> 8) -
                                    (0xff < uVar45),
                                    CONCAT14((uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar42 >> 8)
                                             - (0xff < uVar43),
                                             CONCAT13((uVar41 != 0) * (uVar41 < 0x100) *
                                                      (char)(uVar40 >> 8) - (0xff < uVar41),
                                                      CONCAT12((uVar39 != 0) * (uVar39 < 0x100) *
                                                               (char)(uVar38 >> 8) - (0xff < uVar39)
                                                               ,CONCAT11((uVar37 != 0) *
                                                                         (uVar37 < 0x100) *
                                                                         (char)(uVar36 >> 8) -
                                                                         (0xff < uVar37),
                                                                         (uVar34 != 0) *
                                                                         (uVar34 < 0x100) *
                                                                         (char)(uVar33 >> 8) -
                                                                         (0xff < uVar34))))))));
    dst = dst + stride;
  } while (uVar21 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_8x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}